

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_query_node.cpp
# Opt level: O3

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::Binder::VisitQueryNode
          (Binder *this,BoundQueryNode *node,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *root)

{
  ResultModifierType RVar1;
  BoundOrderByNode *pBVar2;
  _Head_base<0UL,_duckdb::BoundOrderModifier_*,_false> _Var3;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var4;
  undefined8 uVar5;
  pointer pBVar6;
  BoundDistinctModifier *pBVar7;
  LogicalOrder *pLVar8;
  pointer this_00;
  BoundOrderModifier *pBVar9;
  pointer pLVar10;
  LogicalDistinct *pLVar11;
  _Head_base<0UL,_duckdb::BoundOrderModifier_*,_false> this_01;
  pointer pBVar12;
  pointer this_02;
  BoundLimitModifier *pBVar13;
  LogicalLimit *this_03;
  pointer this_04;
  BinderException *this_05;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *in_RCX;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var14;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> this_06;
  _Head_base<0UL,_duckdb::LogicalLimit_*,_false> _Var15;
  BoundOrderByNode *this_07;
  BoundLimitNode local_b8;
  _Alloc_hider local_98;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Stack_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_70;
  _Head_base<0UL,_duckdb::LogicalLimit_*,_false> local_68;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_60;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_58;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *local_50;
  LogicalOperator *local_48;
  __uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_> local_40;
  LogicalDistinct *local_38;
  
  this_06._M_head_impl =
       root[2].
       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  _Var14._M_head_impl =
       root[3].
       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  local_50 = in_RCX;
  local_48 = _Var14._M_head_impl;
  local_40._M_t.
  super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
       (tuple<duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>)
       (tuple<duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>)this;
  if (this_06._M_head_impl != _Var14._M_head_impl) {
    do {
      pBVar6 = unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>
               ::operator->((unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>
                             *)this_06._M_head_impl);
      RVar1 = pBVar6->type;
      if (RVar1 == LIMIT_MODIFIER) {
        pBVar6 = unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>
                 ::operator->((unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>
                               *)this_06._M_head_impl);
        pBVar13 = BoundResultModifier::Cast<duckdb::BoundLimitModifier>(pBVar6);
        this_03 = (LogicalLimit *)operator_new(0xa8);
        local_98._M_p = *(pointer *)&pBVar13->limit_val;
        _Stack_90._M_head_impl = (Expression *)(pBVar13->limit_val).constant_integer;
        local_88._M_allocated_capacity = (size_type)(pBVar13->limit_val).constant_percentage;
        local_88._8_8_ =
             (pBVar13->limit_val).expression.
             super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
        (pBVar13->limit_val).expression.
        super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
        local_b8.constant_percentage = (pBVar13->offset_val).constant_percentage;
        local_b8._0_8_ = *(undefined8 *)&pBVar13->offset_val;
        local_b8.constant_integer = (pBVar13->offset_val).constant_integer;
        local_b8.expression.
        super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
             (pBVar13->offset_val).expression.
             super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
        (pBVar13->offset_val).expression.
        super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
        LogicalLimit::LogicalLimit(this_03,(BoundLimitNode *)&local_98,&local_b8);
        local_68._M_head_impl = this_03;
        if (local_b8.expression.
            super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
            .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl !=
            (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>
             )0x0) {
          (**(code **)(*(long *)local_b8.expression.
                                super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                ._M_t.
                                super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                                .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl + 8
                      ))();
        }
        in_RCX = local_50;
        local_b8.expression.
        super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
             (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>
              )0x0;
        if ((Expression *)local_88._8_8_ != (Expression *)0x0) {
          (**(code **)(*(long *)local_88._8_8_ + 8))();
        }
        this_04 = unique_ptr<duckdb::LogicalLimit,_std::default_delete<duckdb::LogicalLimit>,_true>
                  ::operator->((unique_ptr<duckdb::LogicalLimit,_std::default_delete<duckdb::LogicalLimit>,_true>
                                *)&local_68);
        local_70._M_head_impl =
             (in_RCX->
             super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
             )._M_t.
             super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
             .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
        (in_RCX->
        super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
        _M_t.
        super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
        .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
             (LogicalOperator *)0x0;
        LogicalOperator::AddChild
                  (&this_04->super_LogicalOperator,
                   (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                    *)&local_70);
        if (local_70._M_head_impl != (LogicalOperator *)0x0) {
          (*(local_70._M_head_impl)->_vptr_LogicalOperator[1])();
        }
        _Var15._M_head_impl = local_68._M_head_impl;
        local_70._M_head_impl = (LogicalOperator *)0x0;
        local_68._M_head_impl = (LogicalLimit *)0x0;
        _Var4._M_head_impl =
             (in_RCX->
             super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
             )._M_t.
             super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
             .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
        (in_RCX->
        super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
        _M_t.
        super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
        .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
             &(_Var15._M_head_impl)->super_LogicalOperator;
        if (_Var4._M_head_impl != (LogicalOperator *)0x0) {
          (**(code **)((long)(_Var4._M_head_impl)->_vptr_LogicalOperator + 8))();
          _Var15._M_head_impl = local_68._M_head_impl;
          goto LAB_00d96265;
        }
      }
      else {
        if (RVar1 == ORDER_MODIFIER) {
          pBVar6 = unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>
                   ::operator->((unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>
                                 *)this_06._M_head_impl);
          pBVar9 = BoundResultModifier::Cast<duckdb::BoundOrderModifier>(pBVar6);
          pLVar10 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                    ::operator->(in_RCX);
          if (pLVar10->type == LOGICAL_DISTINCT) {
            pLVar10 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                      ::operator->(in_RCX);
            pLVar11 = LogicalOperator::Cast<duckdb::LogicalDistinct>(pLVar10);
            if ((pLVar11->super_LogicalOperator).field_0x61 == '\x01') {
              local_38 = pLVar11;
              this_01._M_head_impl = (BoundOrderModifier *)operator_new(0x28);
              BoundOrderModifier::BoundOrderModifier(this_01._M_head_impl);
              pBVar2 = (pBVar9->orders).
                       super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                       .
                       super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              _Var14._M_head_impl = local_48;
              for (this_07 = (pBVar9->orders).
                             super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                             .
                             super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                  local_48 = _Var14._M_head_impl, this_07 != pBVar2; this_07 = this_07 + 1) {
                local_b8._0_8_ = this_01._M_head_impl;
                pBVar12 = unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>,_true>
                          ::operator->((unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>,_true>
                                        *)&local_b8);
                BoundOrderByNode::Copy((BoundOrderByNode *)&local_98,this_07);
                ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::
                emplace_back<duckdb::BoundOrderByNode>
                          (&(pBVar12->orders).
                            super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                           ,(BoundOrderByNode *)&local_98);
                uVar5 = local_88._M_allocated_capacity;
                if ((_Head_base<0UL,_duckdb::BaseStatistics_*,_false>)local_88._M_allocated_capacity
                    != (_Head_base<0UL,_duckdb::BaseStatistics_*,_false>)0x0) {
                  BaseStatistics::~BaseStatistics((BaseStatistics *)local_88._M_allocated_capacity);
                  operator_delete((void *)uVar5);
                }
                local_88._M_allocated_capacity = 0;
                if ((_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                     )_Stack_90._M_head_impl != (Expression *)0x0) {
                  (**(code **)((long)*(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                       *)_Stack_90._M_head_impl + 8))();
                }
                this_01._M_head_impl = (BoundOrderModifier *)local_b8._0_8_;
                _Var14._M_head_impl = local_48;
              }
              local_b8._0_8_ = (BoundOrderModifier *)0x0;
              _Var3._M_head_impl =
                   (local_38->order_by).
                   super_unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>_>
                   ._M_t.
                   super___uniq_ptr_impl<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::BoundOrderModifier_*,_std::default_delete<duckdb::BoundOrderModifier>_>
                   .super__Head_base<0UL,_duckdb::BoundOrderModifier_*,_false>._M_head_impl;
              (local_38->order_by).
              super_unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>_>
              ._M_t.
              super___uniq_ptr_impl<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::BoundOrderModifier_*,_std::default_delete<duckdb::BoundOrderModifier>_>
              .super__Head_base<0UL,_duckdb::BoundOrderModifier_*,_false>._M_head_impl =
                   this_01._M_head_impl;
              if ((_Var3._M_head_impl != (BoundOrderModifier *)0x0) &&
                 ((**(code **)(*(long *)&(_Var3._M_head_impl)->super_BoundResultModifier + 8))(),
                 (BoundOrderModifier *)local_b8._0_8_ != (BoundOrderModifier *)0x0)) {
                (*((BoundResultModifier *)local_b8._0_8_)->_vptr_BoundResultModifier[1])();
              }
            }
          }
          pLVar8 = (LogicalOrder *)operator_new(0x98);
          local_98._M_p =
               (pointer)(pBVar9->orders).
                        super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                        .
                        super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                        ._M_impl.super__Vector_impl_data._M_start;
          _Stack_90._M_head_impl =
               (Expression *)
               (pBVar9->orders).
               super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
               super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_88._M_allocated_capacity =
               (size_type)
               (pBVar9->orders).
               super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
               super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          (pBVar9->orders).
          super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
          super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (pBVar9->orders).
          super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
          super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (pBVar9->orders).
          super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
          super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          LogicalOrder::LogicalOrder(pLVar8,(vector<duckdb::BoundOrderByNode,_true> *)&local_98);
          local_b8._0_8_ = pLVar8;
          ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::
          ~vector((vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_> *)
                  &local_98);
          this_02 = unique_ptr<duckdb::LogicalOrder,_std::default_delete<duckdb::LogicalOrder>,_true>
                    ::operator->((unique_ptr<duckdb::LogicalOrder,_std::default_delete<duckdb::LogicalOrder>,_true>
                                  *)&local_b8);
          in_RCX = local_50;
          local_60._M_head_impl =
               (local_50->
               super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
               )._M_t.
               super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
               .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
          (local_50->
          super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
          _M_t.
          super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
          .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
               (LogicalOperator *)0x0;
          LogicalOperator::AddChild
                    (&this_02->super_LogicalOperator,
                     (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                      *)&local_60);
          if (local_60._M_head_impl != (LogicalOperator *)0x0) {
            (*(local_60._M_head_impl)->_vptr_LogicalOperator[1])();
          }
          local_60._M_head_impl = (LogicalOperator *)0x0;
        }
        else {
          if (RVar1 != DISTINCT_MODIFIER) {
            this_05 = (BinderException *)__cxa_allocate_exception(0x10);
            local_98._M_p = (pointer)&local_88;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_98,"Unimplemented modifier type!","");
            BinderException::BinderException(this_05,(string *)&local_98);
            __cxa_throw(this_05,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
          }
          pBVar6 = unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>
                   ::operator->((unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>
                                 *)this_06._M_head_impl);
          pBVar7 = BoundResultModifier::Cast<duckdb::BoundDistinctModifier>(pBVar6);
          if ((pBVar7->target_distincts).
              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              (pBVar7->target_distincts).
              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) goto LAB_00d96270;
          pLVar8 = (LogicalOrder *)operator_new(0x88);
          local_98._M_p =
               (pointer)(pBVar7->target_distincts).
                        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                        .
                        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
          _Stack_90._M_head_impl =
               (Expression *)
               (pBVar7->target_distincts).
               super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_88._M_allocated_capacity =
               (size_type)
               (pBVar7->target_distincts).
               super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          (pBVar7->target_distincts).
          super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (pBVar7->target_distincts).
          super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (pBVar7->target_distincts).
          super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          LogicalDistinct::LogicalDistinct
                    ((LogicalDistinct *)pLVar8,
                     (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                      *)&local_98,(pBVar7->super_BoundResultModifier).field_0x9);
          local_b8._0_8_ = pLVar8;
          ::std::
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     *)&local_98);
          this_00 = unique_ptr<duckdb::LogicalDistinct,_std::default_delete<duckdb::LogicalDistinct>,_true>
                    ::operator->((unique_ptr<duckdb::LogicalDistinct,_std::default_delete<duckdb::LogicalDistinct>,_true>
                                  *)&local_b8);
          in_RCX = local_50;
          local_58._M_head_impl =
               (local_50->
               super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
               )._M_t.
               super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
               .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
          (local_50->
          super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
          _M_t.
          super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
          .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
               (LogicalOperator *)0x0;
          LogicalOperator::AddChild
                    (&this_00->super_LogicalOperator,
                     (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                      *)&local_58);
          _Var14._M_head_impl = local_48;
          if (local_58._M_head_impl != (LogicalOperator *)0x0) {
            (*(local_58._M_head_impl)->_vptr_LogicalOperator[1])();
          }
          local_58._M_head_impl = (LogicalOperator *)0x0;
        }
        uVar5 = local_b8._0_8_;
        local_b8._0_8_ = (BoundOrderModifier *)0x0;
        _Var4._M_head_impl =
             (in_RCX->
             super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
             )._M_t.
             super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
             .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
        (in_RCX->
        super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
        _M_t.
        super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
        .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
             (LogicalOperator *)uVar5;
        if (_Var4._M_head_impl != (LogicalOperator *)0x0) {
          (**(code **)((long)(_Var4._M_head_impl)->_vptr_LogicalOperator + 8))();
          _Var15._M_head_impl = (LogicalLimit *)local_b8._0_8_;
LAB_00d96265:
          if (_Var15._M_head_impl != (LogicalLimit *)0x0) {
            (*((_Var15._M_head_impl)->super_LogicalOperator)._vptr_LogicalOperator[1])();
          }
        }
      }
LAB_00d96270:
      this_06._M_head_impl = (LogicalOperator *)&(this_06._M_head_impl)->type;
    } while (this_06._M_head_impl != _Var14._M_head_impl);
  }
  *(LogicalOperator **)
   local_40._M_t.
   super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
   super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
       (in_RCX->
       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
       _M_t.
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  (in_RCX->super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
  ._M_t.
  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (_Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         )local_40._M_t.
          super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
          .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<LogicalOperator> Binder::VisitQueryNode(BoundQueryNode &node, unique_ptr<LogicalOperator> root) {
	D_ASSERT(root);
	for (auto &mod : node.modifiers) {
		switch (mod->type) {
		case ResultModifierType::DISTINCT_MODIFIER: {
			auto &bound = mod->Cast<BoundDistinctModifier>();
			if (bound.target_distincts.empty()) {
				break;
			}
			auto distinct = make_uniq<LogicalDistinct>(std::move(bound.target_distincts), bound.distinct_type);
			distinct->AddChild(std::move(root));
			root = std::move(distinct);
			break;
		}
		case ResultModifierType::ORDER_MODIFIER: {
			auto &bound = mod->Cast<BoundOrderModifier>();
			if (root->type == LogicalOperatorType::LOGICAL_DISTINCT) {
				auto &distinct = root->Cast<LogicalDistinct>();
				if (distinct.distinct_type == DistinctType::DISTINCT_ON) {
					auto order_by = make_uniq<BoundOrderModifier>();
					for (auto &order_node : bound.orders) {
						order_by->orders.push_back(order_node.Copy());
					}
					distinct.order_by = std::move(order_by);
				}
			}
			auto order = make_uniq<LogicalOrder>(std::move(bound.orders));
			order->AddChild(std::move(root));
			root = std::move(order);
			break;
		}
		case ResultModifierType::LIMIT_MODIFIER: {
			auto &bound = mod->Cast<BoundLimitModifier>();
			auto limit = make_uniq<LogicalLimit>(std::move(bound.limit_val), std::move(bound.offset_val));
			limit->AddChild(std::move(root));
			root = std::move(limit);
			break;
		}
		default:
			throw BinderException("Unimplemented modifier type!");
		}
	}
	return root;
}